

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLUtil.cpp
# Opt level: O3

EGLConfig eglu::chooseConfig(Library *egl,EGLDisplay display,RenderConfig *config)

{
  SurfaceType SVar1;
  void *pvVar2;
  long lVar3;
  EGLConfig pvVar4;
  uint uVar5;
  deUint32 dVar6;
  pointer ppvVar7;
  NotSupportedError *this;
  long lVar8;
  EGLint renderableType;
  vector<void_*,_std::allocator<void_*>_> configs;
  uint local_5c;
  EGLDisplay local_58;
  pointer local_50;
  vector<void_*,_std::allocator<void_*>_> local_48;
  
  local_58 = display;
  getConfigs(&local_48,egl,display);
  ppvVar7 = local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      pvVar2 = *ppvVar7;
      local_5c = 0;
      local_50 = ppvVar7;
      uVar5 = apiRenderableType((ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
      (*egl->_vptr_Library[0x19])(egl,local_58,pvVar2,0x3040,&local_5c);
      dVar6 = (*egl->_vptr_Library[0x1f])(egl);
      checkError(dVar6,"getConfigAttrib(display, eglConfig, EGL_RENDERABLE_TYPE, &renderableType)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0xc4);
      if ((local_5c & uVar5) != 0) {
        SVar1 = config->surfaceType;
        if ((long)(int)SVar1 == 0) {
LAB_001774b1:
          lVar8 = 0;
          do {
            lVar3 = *(long *)((long)&configMatches(eglw::Library_const&,void*,void*,glu::RenderConfig_const&)
                                     ::s_attribs + lVar8);
            if (*(int *)((long)&(config->type).super_ApiType.m_bits + lVar3) != -1) {
              local_5c = 0;
              (*egl->_vptr_Library[0x19])
                        (egl,local_58,pvVar2,(ulong)*(uint *)((long)&DAT_00222ee8 + lVar8),&local_5c
                        );
              dVar6 = (*egl->_vptr_Library[0x1f])(egl);
              checkError(dVar6,
                         "getConfigAttrib(display, eglConfig, s_attribs[attribNdx].attrib, &value)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                         ,0xf4);
              if (local_5c != *(uint *)((long)&(config->type).super_ApiType.m_bits + lVar3))
              goto LAB_00177524;
            }
            lVar8 = lVar8 + 0x10;
            if (lVar8 == 0x80) {
              pvVar4 = *local_50;
              if (local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                .super__Vector_impl_data._M_start,
                                (long)local_48.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_48.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              return pvVar4;
            }
          } while( true );
        }
        local_5c = 0;
        uVar5 = 0;
        if (SVar1 < SURFACETYPE_LAST) {
          uVar5 = *(uint *)(&DAT_00222f8c + (long)(int)SVar1 * 4);
        }
        (*egl->_vptr_Library[0x19])(egl,local_58,pvVar2,0x3033,&local_5c);
        dVar6 = (*egl->_vptr_Library[0x1f])(egl);
        checkError(dVar6,"getConfigAttrib(display, eglConfig, EGL_SURFACE_TYPE, &surfaceType)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                   ,0xd8);
        if ((local_5c & uVar5) != 0) goto LAB_001774b1;
      }
LAB_00177524:
      ppvVar7 = local_50 + 1;
    } while (local_50 + 1 !=
             local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"Matching EGL config not found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
             ,0x108);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

EGLConfig chooseConfig (const Library& egl, EGLDisplay display, const glu::RenderConfig& config)
{
	const std::vector<EGLConfig> configs = eglu::getConfigs(egl, display);

	for (vector<EGLConfig>::const_iterator iter = configs.begin(); iter != configs.end(); ++iter)
	{
		if (configMatches(egl, display, *iter, config))
			return *iter;
	}

	throw tcu::NotSupportedError("Matching EGL config not found", DE_NULL, __FILE__, __LINE__);
}